

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *args_3;
  LibraryDeclarationSyntax *pLVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  LibraryIncDirClauseSyntax *local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::FilePathSpecSyntax>
                     ((SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xa8) == (SyntaxNode *)0x0) {
    local_30 = (LibraryIncDirClauseSyntax *)0x0;
  }
  else {
    local_30 = (LibraryIncDirClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0xa8),(DeepCloneVisitor *)&local_40,
                          (BumpAllocator *)__child_stack);
  }
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0xb0),(BumpAllocator *)__child_stack);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LibraryDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>&,slang::syntax::LibraryIncDirClauseSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_50,&local_60,args_3,&local_30,
                      &local_40);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LibraryDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LibraryDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.library.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone(node.filePaths, alloc),
        node.incDirClause ? deepClone(*node.incDirClause, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}